

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_collection_unittest.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::TrustStoreCollectionTest_OneStore_Test::
~TrustStoreCollectionTest_OneStore_Test(TrustStoreCollectionTest_OneStore_Test *this)

{
  TrustStoreCollectionTest::~TrustStoreCollectionTest(&this->super_TrustStoreCollectionTest);
  operator_delete(this,0x70);
  return;
}

Assistant:

TEST_F(TrustStoreCollectionTest, OneStore) {
  ParsedCertificateList issuers;

  TrustStoreCollection collection;
  TrustStoreInMemory in_memory;
  in_memory.AddTrustAnchor(newroot_);
  collection.AddTrustStore(&in_memory);
  collection.SyncGetIssuersOf(newintermediate_.get(), &issuers);

  ASSERT_EQ(1U, issuers.size());
  EXPECT_EQ(newroot_.get(), issuers[0].get());

  // newroot_ is trusted.
  CertificateTrust trust = collection.GetTrust(newroot_.get());
  EXPECT_EQ(CertificateTrust::ForTrustAnchor().ToDebugString(),
            trust.ToDebugString());

  // oldroot_ is not.
  trust = collection.GetTrust(oldroot_.get());
  EXPECT_EQ(CertificateTrust::ForUnspecified().ToDebugString(),
            trust.ToDebugString());
}